

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O2

char * dfdToStringDescriptorType(khr_df_khr_descriptortype_e value)

{
  if (value == KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT) {
    return "KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT";
  }
  if (value != KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_DIMENSIONS) {
    if (value == KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_PLANES) {
      return "KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_PLANES";
    }
    return (char *)0x0;
  }
  return "KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_DIMENSIONS";
}

Assistant:

const char* dfdToStringDescriptorType(khr_df_khr_descriptortype_e value) {
    switch (value) {
    case KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT:
        return "KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT";
    case KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_PLANES:
        return "KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_PLANES";
    case KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_DIMENSIONS:
        return "KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_DIMENSIONS";

    case KHR_DF_KHR_DESCRIPTORTYPE_NEEDED_FOR_WRITE_BIT:
    case KHR_DF_KHR_DESCRIPTORTYPE_NEEDED_FOR_DECODE_BIT:
    case KHR_DF_KHR_DESCRIPTORTYPE_MAX:
        // These enum values are not meant for string representation. Ignore
        break;
    }
    return NULL;
}